

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O3

int coda_ascbin_cursor_goto_array_element(coda_cursor_conflict *cursor,int num_subs,long *subs)

{
  int64_t *piVar1;
  long lVar2;
  int iVar3;
  char *in_RAX;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  coda_type *pcVar7;
  long lVar8;
  coda_type *pcVar9;
  int64_t var_dim;
  char *local_38;
  
  iVar3 = cursor->n;
  lVar4 = (long)iVar3;
  pcVar9 = (coda_type *)cursor->stack[lVar4 + -1].type;
  if (99 < pcVar9->format) {
    pcVar9 = *(coda_type **)&pcVar9->type_class;
  }
  if (*(int *)&pcVar9[1].name == num_subs) {
    local_38 = in_RAX;
    if (num_subs < 1) {
      lVar8 = 0;
    }
    else {
      lVar4 = 0;
      lVar8 = 0;
      do {
        pcVar5 = (&pcVar9[1].description)[lVar4];
        if (((&pcVar9[1].description)[lVar4] == (char *)0xffffffffffffffff) &&
           (iVar3 = coda_expression_eval_integer
                              ((coda_expression *)(&pcVar9[2].bit_size)[lVar4],cursor,
                               (int64_t *)&local_38), pcVar5 = local_38, iVar3 != 0)) {
          coda_add_error_message(" for dim[%d] expression",lVar4);
          coda_cursor_add_to_error_message(cursor);
          goto LAB_0014d409;
        }
        lVar2 = subs[lVar4];
        if ((lVar2 < 0) || ((long)pcVar5 <= lVar2)) {
          coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)");
          goto LAB_0014d409;
        }
        if (lVar4 == 0) {
          pcVar5 = (char *)0x1;
        }
        lVar8 = lVar8 * (long)pcVar5 + lVar2;
        lVar4 = lVar4 + 1;
      } while (lVar4 < *(int *)&pcVar9[1].name);
      iVar3 = cursor->n;
      lVar4 = (long)iVar3;
    }
    uVar6 = (ulong)(iVar3 + 1U);
    cursor->n = iVar3 + 1U;
    lVar4 = cursor->stack[lVar4 + -1].bit_offset;
    cursor->stack[iVar3].bit_offset = lVar4;
    pcVar7 = *(coda_type **)(pcVar9 + 1);
    if (pcVar7->bit_size < 0) {
      if (0 < lVar8) {
        lVar4 = 0;
        do {
          iVar3 = (int)uVar6 + -1;
          cursor->stack[iVar3].type = (coda_dynamic_type_struct *)*(coda_type **)(pcVar9 + 1);
          cursor->stack[iVar3].index = lVar4;
          iVar3 = coda_cursor_get_bit_size(cursor,(int64_t *)&local_38);
          if (iVar3 != 0) {
            cursor->n = cursor->n + -1;
            goto LAB_0014d409;
          }
          iVar3 = cursor->n;
          uVar6 = (ulong)iVar3;
          piVar1 = &cursor->stack[uVar6 - 1].bit_offset;
          *piVar1 = (int64_t)(local_38 + *piVar1);
          lVar4 = lVar4 + 1;
        } while (lVar8 != lVar4);
        pcVar7 = *(coda_type **)(pcVar9 + 1);
        iVar3 = iVar3 + -1;
      }
    }
    else {
      cursor->stack[iVar3].bit_offset = pcVar7->bit_size * lVar8 + lVar4;
    }
    cursor->stack[iVar3].type = (coda_dynamic_type_struct *)pcVar7;
    cursor->stack[iVar3].index = lVar8;
    iVar3 = 0;
  }
  else {
    coda_set_error(-0x6a,"number of dimensions argument (%d) does not match rank of  array (%d)");
LAB_0014d409:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int coda_ascbin_cursor_goto_array_element(coda_cursor *cursor, int num_subs, const long subs[])
{
    coda_type_array *array;
    long offset_elements;
    long i;

    array = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    /* check the number of dimensions */
    if (num_subs != array->num_dims)
    {
        coda_set_error(CODA_ERROR_ARRAY_NUM_DIMS_MISMATCH, "number of dimensions argument (%d) does not match rank of "
                       " array (%d)", num_subs, array->num_dims);
        return -1;
    }

    /* check the dimensions... */
    offset_elements = 0;
    for (i = 0; i < array->num_dims; i++)
    {
        long dim;

        if (array->dim[i] == -1)
        {
            int64_t var_dim;

            if (coda_expression_eval_integer(array->dim_expr[i], cursor, &var_dim) != 0)
            {
                coda_add_error_message(" for dim[%d] expression", i);
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            dim = (long)var_dim;
        }
        else
        {
            dim = array->dim[i];
        }

        if (subs[i] < 0 || subs[i] >= dim)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", subs[i],
                           dim);
            return -1;
        }
        if (i > 0)
        {
            offset_elements *= dim;
        }
        offset_elements += subs[i];
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].bit_offset = cursor->stack[cursor->n - 2].bit_offset;

    if (array->base_type->bit_size >= 0)
    {
        /* if the array base type is simple, do a calculated index calculation. */
        cursor->stack[cursor->n - 1].bit_offset += offset_elements * array->base_type->bit_size;
    }
    else        /* not a simple base type, so walk the elements. */
    {
        for (i = 0; i < offset_elements; i++)
        {
            int64_t bit_size;

            cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
            cursor->stack[cursor->n - 1].index = i;
            if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
            {
                cursor->n--;
                return -1;
            }
            cursor->stack[cursor->n - 1].bit_offset += bit_size;
        }
    }
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
    cursor->stack[cursor->n - 1].index = offset_elements;

    return 0;
}